

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicVector.hpp
# Opt level: O2

DynamicVector<double,_std::allocator<double>_> *
OpenMD::operator-(DynamicVector<double,_std::allocator<double>_> *__return_storage_ptr__,
                 DynamicVector<double,_std::allocator<double>_> *v1,
                 DynamicVector<double,_std::allocator<double>_> *v2)

{
  allocator_type local_19;
  
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->data_,
             (long)(v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_19);
  DynamicVector<double,_std::allocator<double>_>::sub(__return_storage_ptr__,v1,v2);
  return __return_storage_ptr__;
}

Assistant:

DynamicVector<Real> operator-(const DynamicVector<Real>& v1,
                                const DynamicVector<Real>& v2) {
    assert(v1.size() == v2.size());
    DynamicVector<Real> result(v1.size());
    result.sub(v1, v2);
    return result;
  }